

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

Value __thiscall
xmrig::CpuBackendPrivate::hugePages(CpuBackendPrivate *this,int version,Document *doc)

{
  size_t sVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RCX;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  long in_RSI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  Value VVar3;
  pair<unsigned_int,_unsigned_int> pages;
  Value *hugepages;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 value;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  uint in_stack_ffffffffffffffbc;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffc0;
  int local_30 [2];
  pair<unsigned_int,_unsigned_int> local_28;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_20;
  int local_14;
  
  value = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  local_30[1] = 0;
  local_30[0] = 0;
  allocator = in_RDI;
  local_20 = in_RCX;
  local_14 = in_EDX;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_28,local_30 + 1,local_30);
  std::mutex::lock((mutex *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  sVar1 = CpuLaunchStatus::hugePages((CpuLaunchStatus *)(in_RSI + 8));
  local_28.first = local_28.first + (int)sVar1;
  sVar1 = CpuLaunchStatus::pages((CpuLaunchStatus *)(in_RSI + 8));
  local_28.second = local_28.second + (int)sVar1;
  std::mutex::unlock((mutex *)0x1ffd88);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (local_14 < 2) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    operator=((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_RDI,(bool)value);
    uVar2 = extraout_RDX_00;
  }
  else {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GetAllocator(local_20);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,allocator);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GetAllocator(local_20);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,allocator);
    uVar2 = extraout_RDX;
  }
  VVar3.data_.s.str = (Ch *)uVar2;
  VVar3.data_.n = (Number)in_RDI;
  return (Value)VVar3.data_;
}

Assistant:

rapidjson::Value hugePages(int version, rapidjson::Document &doc)
    {
        std::pair<unsigned, unsigned> pages(0, 0);

        mutex.lock();

        pages.first  += status.hugePages();
        pages.second += status.pages();

        mutex.unlock();

        rapidjson::Value hugepages;

        if (version > 1) {
            hugepages.SetArray();
            hugepages.PushBack(pages.first, doc.GetAllocator());
            hugepages.PushBack(pages.second, doc.GetAllocator());
        }
        else {
            hugepages = pages.first == pages.second;
        }

        return hugepages;
    }